

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameboard.cpp
# Opt level: O2

bool __thiscall GameBoard::winConditionSatisfied(GameBoard *this)

{
  uint uVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  bool bVar5;
  reference pQVar6;
  ulong uVar7;
  uint uVar8;
  bool bVar9;
  QVector<QVector<Field_*>_> *this_00;
  long lVar10;
  long i;
  int j;
  ulong uVar11;
  int j_1;
  ulong uVar12;
  QString symbol;
  QArrayDataPointer<char16_t> local_48;
  
  uVar1 = this->width_;
  this_00 = &this->grid_;
  uVar12 = 0;
  uVar7 = 0;
  if (0 < (int)uVar1) {
    uVar7 = (ulong)uVar1;
  }
  for (; uVar12 != uVar7; uVar12 = uVar12 + 1) {
    pQVar6 = QList<QList<Field_*>_>::operator[](this_00,uVar12);
    QList<Field_*>::operator[](pQVar6,0);
    QAbstractButton::text();
    uVar8 = 1;
    for (uVar11 = 1; uVar1 != uVar11; uVar11 = uVar11 + 1) {
      pQVar6 = QList<QList<Field_*>_>::operator[](this_00,uVar12);
      QList<Field_*>::operator[](pQVar6,uVar11);
      QAbstractButton::text();
      bVar5 = operator==((QString *)&local_48,(QString *)&symbol.d);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      uVar8 = uVar8 + bVar5;
    }
    if ((uVar8 == uVar1) && (bVar5 = QString::operator!=((QString *)&symbol.d,""), bVar5))
    goto LAB_00108166;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&symbol.d);
  }
  for (uVar12 = 0; uVar12 != uVar7; uVar12 = uVar12 + 1) {
    pQVar6 = QList<QList<Field_*>_>::operator[](this_00,0);
    QList<Field_*>::operator[](pQVar6,uVar12);
    QAbstractButton::text();
    uVar8 = 1;
    for (uVar11 = 1; uVar1 != uVar11; uVar11 = uVar11 + 1) {
      pQVar6 = QList<QList<Field_*>_>::operator[](this_00,uVar11);
      QList<Field_*>::operator[](pQVar6,uVar12);
      QAbstractButton::text();
      bVar5 = operator==((QString *)&local_48,(QString *)&symbol.d);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      uVar8 = uVar8 + bVar5;
    }
    if ((uVar8 == uVar1) && (bVar5 = QString::operator!=((QString *)&symbol.d,""), bVar5)) {
LAB_00108166:
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&symbol.d);
      return true;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&symbol.d);
  }
  pQVar6 = QList<QList<Field_*>_>::operator[](this_00,0);
  QList<Field_*>::operator[](pQVar6,0);
  QAbstractButton::text();
  uVar8 = 1;
  for (lVar10 = 1; lVar10 < (int)uVar1; lVar10 = lVar10 + 1) {
    pQVar6 = QList<QList<Field_*>_>::operator[](this_00,lVar10);
    QList<Field_*>::operator[](pQVar6,lVar10);
    QAbstractButton::text();
    bVar5 = operator==((QString *)&local_48,&symbol);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    uVar8 = uVar8 + bVar5;
  }
  if (uVar8 == uVar1) {
    bVar5 = QString::operator!=(&symbol,"");
    bVar9 = true;
    if (bVar5) goto LAB_001082f3;
  }
  pQVar6 = QList<QList<Field_*>_>::operator[](this_00,(long)(int)uVar1 + -1);
  QList<Field_*>::operator[](pQVar6,0);
  QAbstractButton::text();
  qVar4 = symbol.d.size;
  pcVar3 = symbol.d.ptr;
  pDVar2 = symbol.d.d;
  symbol.d.d = local_48.d;
  symbol.d.ptr = local_48.ptr;
  local_48.d = pDVar2;
  local_48.ptr = pcVar3;
  symbol.d.size = local_48.size;
  local_48.size = qVar4;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  i = (long)(int)(uVar1 - 2);
  uVar8 = 1;
  for (lVar10 = 1; lVar10 < (int)uVar1; lVar10 = lVar10 + 1) {
    pQVar6 = QList<QList<Field_*>_>::operator[](this_00,i);
    QList<Field_*>::operator[](pQVar6,lVar10);
    QAbstractButton::text();
    bVar5 = operator==((QString *)&local_48,&symbol);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    uVar8 = uVar8 + bVar5;
    i = i + -1;
  }
  if (uVar8 == uVar1) {
    bVar5 = QString::operator!=(&symbol,"");
    bVar9 = true;
    if (bVar5) goto LAB_001082f3;
  }
  bVar9 = false;
LAB_001082f3:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&symbol.d);
  return bVar9;
}

Assistant:

bool GameBoard::winConditionSatisfied()
{
    // Check horizontally
    int N = width_; //Our application only works with square maps
    for(int i = 0; i < N; i++)
    {
        int matches = 1; // first symbol matches itself
        QString symbol = grid_[i][0]->text(); //Check if field holds X, O or is blank
        for(int j = 1; j < N; j++)
        {
            if(grid_[i][j]->text() == symbol)
                matches++;
        }
        if(matches == N && symbol != "")
            return true;
    }

    //Check vertically
    for(int j = 0; j < N; j++)
    {
        int matches = 1; // first symbol matches itself
        QString symbol = grid_[0][j]->text(); //Check if field holds X, O or is blank
        for(int i = 1; i < N; i++)
        {
            if(grid_[i][j]->text() == symbol)
                matches++;
        }
        if(matches == N && symbol != "")
            return true;
    }

    //Check diagonally
    //First check top left to bottom right:
    QString symbol = grid_[0][0]->text();
    int matches = 1;
    for(int i = 1; i < N; i++)
    {
        if(grid_[i][i]->text() == symbol)
            matches++;
    }
    if(matches == N && symbol != "")
        return true;

    //check bottom left to top right
    matches = 1;
    symbol = grid_[N-1][0]->text();
    for(int i = N-2, j = 1; j < N; i--, j++)
    {
        if(grid_[i][j]->text() == symbol)
            matches++;
    }
    if(matches == N && symbol != "")
        return true;

    return false; // If none of the previous checks returned true, win condition is not satisfied
}